

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cert.cc
# Opt level: O1

bool bssl::ssl_check_leaf_certificate(SSL_HANDSHAKE *hs,EVP_PKEY *pkey,CRYPTO_BUFFER *leaf)

{
  uint uVar1;
  bool bVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  int iVar5;
  point_conversion_form_t pVar6;
  EC_KEY *key;
  EC_GROUP *group;
  int line;
  uint16_t group_id;
  uint16_t local_1a;
  
  uVar3 = ssl_protocol_version(hs->ssl);
  if (0x303 < uVar3) {
    __assert_fail("ssl_protocol_version(hs->ssl) < TLS1_3_VERSION",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                  ,0x1dd,
                  "bool bssl::ssl_check_leaf_certificate(SSL_HANDSHAKE *, EVP_PKEY *, const CRYPTO_BUFFER *)"
                 );
  }
  uVar1 = hs->new_cipher->algorithm_auth;
  uVar4 = ssl_cipher_auth_mask_for_key(pkey,true);
  if ((uVar4 & uVar1) == 0) {
    iVar5 = 0xf1;
    line = 0x1e5;
  }
  else {
    iVar5 = EVP_PKEY_id((EVP_PKEY *)pkey);
    if (iVar5 != 0x198) {
      return true;
    }
    key = EVP_PKEY_get0_EC_KEY(pkey);
    group = EC_KEY_get0_group((EC_KEY *)key);
    iVar5 = EC_GROUP_get_curve_name(group);
    bVar2 = ssl_nid_to_group_id(&local_1a,iVar5);
    if (((bVar2) && (bVar2 = tls1_check_group_id(hs,local_1a), bVar2)) &&
       (pVar6 = EC_KEY_get_conv_form((EC_KEY *)key), pVar6 == POINT_CONVERSION_UNCOMPRESSED)) {
      return true;
    }
    iVar5 = 0x6b;
    line = 0x1f1;
  }
  ERR_put_error(0x10,0,iVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                ,line);
  return false;
}

Assistant:

bool ssl_check_leaf_certificate(SSL_HANDSHAKE *hs, EVP_PKEY *pkey,
                                const CRYPTO_BUFFER *leaf) {
  assert(ssl_protocol_version(hs->ssl) < TLS1_3_VERSION);

  // Check the certificate's type matches the cipher. This does not check key
  // usage restrictions, which are handled separately.
  //
  // TODO(davidben): Put the key type and key usage checks in one place.
  if (!(hs->new_cipher->algorithm_auth &
        ssl_cipher_auth_mask_for_key(pkey, /*sign_ok=*/true))) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_WRONG_CERTIFICATE_TYPE);
    return false;
  }

  if (EVP_PKEY_id(pkey) == EVP_PKEY_EC) {
    // Check the key's group and point format are acceptable.
    EC_KEY *ec_key = EVP_PKEY_get0_EC_KEY(pkey);
    uint16_t group_id;
    if (!ssl_nid_to_group_id(
            &group_id, EC_GROUP_get_curve_name(EC_KEY_get0_group(ec_key))) ||
        !tls1_check_group_id(hs, group_id) ||
        EC_KEY_get_conv_form(ec_key) != POINT_CONVERSION_UNCOMPRESSED) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_ECC_CERT);
      return false;
    }
  }

  return true;
}